

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  Mat *pMVar25;
  Option *pOVar26;
  int iVar27;
  _func_int *p_Var28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  int outw;
  int iVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  undefined8 *puVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  int iVar49;
  void *pvVar51;
  size_t sVar52;
  long lVar53;
  undefined8 *puVar54;
  void *pvVar55;
  int iVar56;
  int iVar57;
  void *pvVar58;
  bool bVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  void *local_230;
  void *local_228;
  int w;
  ulong local_218;
  float local_20c;
  void *local_208;
  void *local_200;
  long local_1f8;
  int local_1ec;
  Mat *local_1e8;
  void *local_1e0;
  Option *local_1d8;
  Mat *local_1d0;
  Option opt_q;
  float scale_out;
  Mat top_blob_int32;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [56];
  int local_40;
  size_t local_38;
  undefined4 uVar19;
  undefined3 uVar21;
  undefined2 uVar23;
  ulong uVar50;
  
  local_78._24_4_ = bottom_blob->elempack;
  if (local_78._24_4_ == 0) {
    bVar59 = false;
  }
  else {
    bVar59 = ((int)bottom_blob->elemsize << 3) / (int)local_78._24_4_ == 8;
  }
  piVar5 = bottom_blob->refcount;
  local_78._0_8_ = bottom_blob->data;
  local_78._8_4_ = SUB84(bottom_blob->refcount,0);
  local_78._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_78._16_8_ = bottom_blob->elemsize;
  local_78._32_8_ = bottom_blob->allocator;
  local_78._40_4_ = bottom_blob->dims;
  local_78._44_4_ = bottom_blob->w;
  local_78._48_4_ = bottom_blob->h;
  local_78._52_4_ = bottom_blob->d;
  local_40 = bottom_blob->c;
  local_38 = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (!bVar59) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar17 = opt->openmp_blocktime;
    uVar18 = opt->use_winograd_convolution;
    uVar20 = opt->use_sgemm_convolution;
    uVar22 = opt->use_int8_inference;
    uVar24 = opt->use_vulkan_compute;
    uVar23 = CONCAT11(uVar24,uVar22);
    uVar21 = CONCAT21(uVar23,uVar20);
    uVar19 = CONCAT31(uVar21,uVar18);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar17;
    opt_q._28_4_ = uVar19;
    quantize_to_int8(bottom_blob,(Mat *)local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx[-3]),&opt_q)
    ;
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx + (long)this->_vptr_Convolution_x86_avx[-3]),
             (Mat *)local_78,&bottom_blob_bordered,opt);
  iVar3 = bottom_blob_bordered.c;
  iVar49 = bottom_blob_bordered.elempack;
  iVar40 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_001bbc9d;
  p_Var28 = this->_vptr_Convolution_x86_avx[-3];
  iVar56 = (~((*(int *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar57 = (~((*(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var28) +
           1;
  sVar52 = 1;
  if (opt->use_packing_layout == true) {
    sVar52 = (size_t)((uint)(((byte)(p_Var28 + 0x30)[(long)&(this->weight_data_3x3_winograd63).data]
                             & 3) == 0) * 3 + 1);
  }
  local_1ec = *(int *)(p_Var28 + 0x18 + (long)&(this->weight_data_int8).data);
  iVar4 = (int)sVar52;
  uVar29 = (ulong)(uint)(iVar4 * 4);
  if (100 < local_1ec) {
    uVar29 = sVar52;
  }
  Mat::create(top_blob,iVar56,iVar57,
              *(int *)(p_Var28 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) / iVar4,
              uVar29,iVar4,opt->blob_allocator);
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob->data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_001bbc9d;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32.elemsize = 0;
  top_blob_int32.elempack = 0;
  top_blob_int32.allocator = (Allocator *)0x0;
  top_blob_int32.dims = 0;
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  local_1e8 = top_blob;
  local_1d8 = opt;
  Mat::create(&top_blob_int32,iVar56,iVar57,
              *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / iVar4,
              (ulong)(uint)(iVar4 * 4),iVar4,opt->workspace_allocator);
  iVar27 = bottom_blob_bordered.c;
  iVar31 = bottom_blob_bordered.w;
  iVar57 = top_blob_int32.h;
  iVar56 = top_blob_int32.w;
  iVar40 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob_int32.data != (void *)0x0) &&
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob_int32.c * top_blob_int32.cstep != 0)) {
    if ((iVar49 == 8) && (iVar4 == 4)) {
      p_Var28 = this->_vptr_Convolution_x86_avx[-3];
      uVar41 = *(uint *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((ulong)uVar41 == 1) {
        if ((((*(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1) &&
             (*(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var28) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1d8);
        }
        else {
          if ((((uVar41 != 1) ||
               ((*(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
                (*(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1))))
              || (*(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1))
             || ((*(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2 ||
                 (*(int *)((long)&this->convolution_dilation1 + (long)p_Var28) != 2))))
          goto LAB_001ba552;
          conv1x1s2_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1d8);
        }
      }
      else {
LAB_001ba552:
        uVar2 = *(uint *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar40 = *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f8 = (long)*(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar34 = *(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var28);
        uVar39 = (ulong)(uint)bottom_blob_bordered.c;
        uVar29 = (ulong)(uint)top_blob_int32.w;
        pvVar51 = (void *)(ulong)(uint)top_blob_int32.h;
        if (local_1d8->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar41 * uVar2,
                      bottom_blob_bordered.c,8,8,local_1d8->workspace_allocator);
          local_1d0 = &this->weight_data_int8;
          if (0 < iVar27) {
            iVar31 = iVar31 * (int)local_208;
            local_1e0 = bottom_blob_bordered.data;
            local_208 = (void *)opt_q._0_8_;
            local_200 = (void *)(bottom_blob_bordered.w * local_1f8);
            local_228 = (void *)0x0;
            do {
              if (0 < (int)uVar2) {
                local_1f8 = bottom_blob_bordered.elemsize * (long)local_200;
                uVar47 = 0;
                puVar54 = (undefined8 *)opt_q._0_8_;
                do {
                  if (0 < (int)uVar41) {
                    uVar38 = 0;
                    do {
                      if (0 < iVar57) {
                        puVar45 = (undefined8 *)
                                  ((long)bottom_blob_bordered.data +
                                  uVar38 * (long)iVar40 * 8 +
                                  local_1f8 * uVar47 +
                                  bottom_blob_bordered.cstep * (long)local_228 *
                                  bottom_blob_bordered.elemsize);
                        iVar27 = 0;
                        do {
                          uVar50 = uVar29;
                          if (0 < iVar56) {
                            do {
                              *puVar54 = *puVar45;
                              puVar54 = puVar54 + 1;
                              puVar45 = puVar45 + iVar34;
                              uVar48 = (int)uVar50 - 1;
                              uVar50 = (ulong)uVar48;
                            } while (uVar48 != 0);
                          }
                          puVar45 = puVar45 + (iVar31 - iVar56 * iVar34);
                          iVar27 = iVar27 + 1;
                        } while (iVar27 != iVar57);
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar41);
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != uVar2);
              }
              local_228 = (void *)((long)local_228 + 1);
            } while (local_228 != (void *)uVar39);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,local_1d0,local_1d8);
          piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (opt_q._32_8_ == 0) {
                if (opt_q._0_8_ != 0) {
                  free((void *)opt_q._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
          local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
          uVar48 = uVar41 * uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar48,
                     (allocator_type *)&local_20c);
          if (0 < (int)uVar2) {
            iVar37 = 0;
            iVar32 = 0;
            uVar42 = 0;
            do {
              if (0 < (int)uVar41) {
                lVar44 = 0;
                do {
                  *(int *)(opt_q._0_8_ + (long)iVar37 * 4 + lVar44 * 4) = iVar32;
                  iVar32 = iVar32 + iVar40;
                  lVar44 = lVar44 + 1;
                } while (uVar41 != (uint)lVar44);
                iVar37 = iVar37 + (uint)lVar44;
              }
              iVar32 = iVar32 + (iVar31 * (int)local_1f8 - iVar40 * uVar41);
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar2);
          }
          if (0 < (int)local_1d0) {
            local_1e0 = (void *)((long)iVar56 * 4);
            local_228 = (void *)0x0;
            do {
              if (0 < iVar57) {
                _w = (void *)(top_blob_int32.cstep * (long)local_228 * top_blob_int32.elemsize +
                             (long)top_blob_int32.data);
                local_200 = (void *)0x0;
                do {
                  if (0 < iVar56) {
                    local_1f8 = (long)local_200 * (long)local_208;
                    uVar47 = 0;
                    do {
                      if (iVar27 < 1) {
                        auVar69 = (undefined1  [16])0x0;
                        auVar62 = (undefined1  [16])0x0;
                        auVar66 = (undefined1  [16])0x0;
                        auVar61 = (undefined1  [16])0x0;
                      }
                      else {
                        pvVar58 = (void *)((this->weight_data_int8).cstep * (long)local_228 *
                                           (this->weight_data_int8).elemsize +
                                          (long)(this->weight_data_int8).data);
                        auVar63 = ZEXT1664((undefined1  [16])0x0);
                        uVar38 = 0;
                        auVar68 = ZEXT1664((undefined1  [16])0x0);
                        auVar67 = ZEXT1664((undefined1  [16])0x0);
                        auVar65 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          if (0 < (int)uVar48) {
                            lVar44 = 0;
                            do {
                              auVar69._8_8_ = 0;
                              auVar69._0_8_ =
                                   *(ulong *)((long)bottom_blob_bordered.data +
                                             (long)*(int *)(opt_q._0_8_ + lVar44) * 8 +
                                             bottom_blob_bordered.elemsize *
                                             bottom_blob_bordered.cstep * uVar38 +
                                             (long)(iVar34 * 8 * (int)uVar47) +
                                             local_1f8 * bottom_blob_bordered.elemsize *
                                             (long)bottom_blob_bordered.w);
                              auVar61 = vpcmpgtb_avx((undefined1  [16])0x0,auVar69);
                              auVar16 = vpunpcklbw_avx(auVar69,auVar61);
                              auVar61 = *(undefined1 (*) [16])((long)pvVar58 + lVar44 * 8);
                              auVar69 = *(undefined1 (*) [16])((long)pvVar58 + lVar44 * 8 + 0x10);
                              auVar62 = vpcmpgtb_avx((undefined1  [16])0x0,auVar61);
                              auVar66 = vpcmpgtb_avx((undefined1  [16])0x0,auVar69);
                              auVar64 = vpunpcklbw_avx(auVar61,auVar62);
                              auVar61 = vpunpckhbw_avx(auVar61,auVar62);
                              auVar62 = vpunpcklbw_avx(auVar69,auVar66);
                              auVar69 = vpunpckhbw_avx(auVar69,auVar66);
                              auVar12 = vpmullw_avx(auVar64,auVar16);
                              auVar64 = vpmulhw_avx(auVar64,auVar16);
                              auVar13 = vpmullw_avx(auVar16,auVar61);
                              auVar10 = vpmulhw_avx(auVar16,auVar61);
                              auVar14 = vpmullw_avx(auVar62,auVar16);
                              auVar11 = vpmulhw_avx(auVar62,auVar16);
                              auVar15 = vpmullw_avx(auVar16,auVar69);
                              auVar16 = vpmulhw_avx(auVar16,auVar69);
                              auVar61 = vpunpcklwd_avx(auVar12,auVar64);
                              auVar61 = vpaddd_avx(auVar63._0_16_,auVar61);
                              auVar69 = vpunpcklwd_avx(auVar13,auVar10);
                              auVar69 = vpaddd_avx(auVar68._0_16_,auVar69);
                              auVar62 = vpunpcklwd_avx(auVar14,auVar11);
                              auVar62 = vpaddd_avx(auVar67._0_16_,auVar62);
                              auVar66 = vpunpcklwd_avx(auVar15,auVar16);
                              auVar66 = vpaddd_avx(auVar65._0_16_,auVar66);
                              auVar64 = vpunpckhwd_avx(auVar12,auVar64);
                              auVar61 = vpaddd_avx(auVar61,auVar64);
                              auVar63 = ZEXT1664(auVar61);
                              auVar61 = vpunpckhwd_avx(auVar13,auVar10);
                              auVar61 = vpaddd_avx(auVar69,auVar61);
                              auVar68 = ZEXT1664(auVar61);
                              auVar61 = vpunpckhwd_avx(auVar14,auVar11);
                              auVar61 = vpaddd_avx(auVar62,auVar61);
                              auVar67 = ZEXT1664(auVar61);
                              auVar61 = vpunpckhwd_avx(auVar15,auVar16);
                              auVar61 = vpaddd_avx(auVar66,auVar61);
                              auVar65 = ZEXT1664(auVar61);
                              lVar44 = lVar44 + 4;
                            } while ((ulong)uVar48 << 2 != lVar44);
                            pvVar58 = (void *)((long)pvVar58 + (ulong)uVar48 * 0x20);
                          }
                          auVar62 = auVar67._0_16_;
                          auVar69 = auVar65._0_16_;
                          auVar66 = auVar68._0_16_;
                          auVar61 = auVar63._0_16_;
                          uVar38 = uVar38 + 1;
                        } while (uVar38 != uVar39);
                      }
                      auVar64 = vpunpckldq_avx(auVar61,auVar66);
                      auVar10 = vpunpckldq_avx(auVar62,auVar69);
                      auVar66 = vpunpckhdq_avx(auVar61,auVar66);
                      auVar69 = vpunpckhdq_avx(auVar62,auVar69);
                      auVar62 = vpunpcklqdq_avx(auVar64,auVar10);
                      auVar61 = vpunpckhqdq_avx(auVar64,auVar10);
                      auVar61 = vpaddd_avx(auVar62,auVar61);
                      auVar62 = vpunpcklqdq_avx(auVar66,auVar69);
                      auVar69 = vpunpckhqdq_avx(auVar66,auVar69);
                      auVar69 = vpaddd_avx(auVar69,auVar62);
                      auVar61 = vpaddd_avx(auVar61,auVar69);
                      *(undefined1 (*) [16])((long)_w + uVar47 * 0x10) = auVar61;
                      uVar47 = uVar47 + 1;
                    } while (uVar47 != uVar29);
                  }
                  _w = (void *)((long)_w + (long)iVar56 * 0x10);
                  local_200 = (void *)((long)local_200 + 1);
                } while (local_200 != pvVar51);
              }
              local_228 = (void *)((long)local_228 + 1);
            } while ((Mat *)local_228 != local_1d0);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
        }
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar26 = local_1d8;
      pMVar25 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx;
      p_Var7 = pp_Var6[-3];
      p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar44 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
          fVar60 = 0.0;
          if (fVar1 != 0.0) {
            fVar60 = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar44 * 4) = fVar60;
          lVar44 = lVar44 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
        } while (lVar44 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar25,pOVar26);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x280),
                   (Mat *)(p_Var28 + 0x1a8),*(int *)(p_Var28 + 0x10c),(Mat *)(p_Var28 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar57 = bottom_blob_bordered.c;
    iVar56 = bottom_blob_bordered.w;
    iVar40 = top_blob_int32.w;
    if ((iVar49 == 1) && (iVar4 == 4)) {
      p_Var28 = this->_vptr_Convolution_x86_avx[-3];
      iVar31 = *(int *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar27 = *(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar34 = *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar37 = *(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1f8 = (long)*(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var28);
      uVar29 = (ulong)(uint)bottom_blob_bordered.c;
      lVar44 = (long)top_blob_int32.w;
      local_200 = (void *)(ulong)(uint)top_blob_int32.h;
      local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
      uVar41 = iVar31 * iVar27;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar41,
                 (allocator_type *)&local_20c);
      if (0 < iVar27) {
        iVar32 = 0;
        iVar35 = 0;
        iVar43 = 0;
        do {
          if (0 < iVar31) {
            lVar46 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar32 * 4 + lVar46 * 4) = iVar35;
              iVar35 = iVar35 + iVar34;
              lVar46 = lVar46 + 1;
            } while (iVar31 != (int)lVar46);
            iVar32 = iVar32 + (int)lVar46;
          }
          iVar35 = iVar35 + (iVar56 * iVar37 - iVar34 * iVar31);
          iVar43 = iVar43 + 1;
        } while (iVar43 != iVar27);
      }
      if (0 < (int)local_1d0) {
        local_1e0 = (void *)(lVar44 * 4);
        _w = (void *)0x0;
        do {
          if (0 < (int)local_200) {
            pvVar51 = (void *)(top_blob_int32.cstep * (long)_w * top_blob_int32.elemsize +
                              (long)top_blob_int32.data);
            local_228 = (void *)0x0;
            do {
              if (0 < iVar40) {
                lVar46 = 0;
                do {
                  if (iVar57 < 1) {
                    auVar61 = (undefined1  [16])0x0;
                  }
                  else {
                    pvVar58 = (void *)((this->weight_data_int8).cstep * (long)_w *
                                       (this->weight_data_int8).elemsize +
                                      (long)(this->weight_data_int8).data);
                    auVar63 = ZEXT1664((undefined1  [16])0x0);
                    uVar39 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        uVar47 = 0;
                        do {
                          auVar61 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  bottom_blob_bordered.data +
                                                  (long)*(int *)(opt_q._0_8_ + uVar47 * 4) +
                                                  bottom_blob_bordered.cstep *
                                                  bottom_blob_bordered.elemsize * uVar39 +
                                                  lVar46 * local_1f8 +
                                                  (long)bottom_blob_bordered.w *
                                                  (long)local_228 * (long)local_208 *
                                                  bottom_blob_bordered.elemsize)),0);
                          auVar62 = vpshufd_avx(auVar61,0);
                          auVar66._8_8_ = 0;
                          auVar66._0_8_ = *(ulong *)((long)pvVar58 + uVar47 * 4);
                          auVar61 = vpcmpgtb_avx((undefined1  [16])0x0,auVar66);
                          auVar61 = vpunpcklbw_avx(auVar66,auVar61);
                          auVar69 = vpmullw_avx(auVar62,auVar61);
                          auVar61 = vpmulhw_avx(auVar62,auVar61);
                          auVar61 = vpunpcklwd_avx(auVar69,auVar61);
                          auVar61 = vpaddd_avx(auVar63._0_16_,auVar61);
                          auVar63 = ZEXT1664(auVar61);
                          uVar47 = uVar47 + 1;
                        } while (uVar41 != uVar47);
                        pvVar58 = (void *)((long)pvVar58 + (ulong)uVar41 * 4);
                      }
                      auVar61 = auVar63._0_16_;
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar29);
                  }
                  *(undefined1 (*) [16])((long)pvVar51 + lVar46 * 0x10) = auVar61;
                  lVar46 = lVar46 + 1;
                } while (lVar46 != lVar44);
              }
              pvVar51 = (void *)((long)pvVar51 + lVar44 * 0x10);
              local_228 = (void *)((long)local_228 + 1);
            } while (local_228 != local_200);
          }
          _w = (void *)((long)_w + 1);
        } while ((Mat *)_w != local_1d0);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar26 = local_1d8;
      pMVar25 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx;
      p_Var7 = pp_Var6[-3];
      p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar44 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
          fVar60 = 0.0;
          if (fVar1 != 0.0) {
            fVar60 = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar44 * 4) = fVar60;
          lVar44 = lVar44 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
        } while (lVar44 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar25,pOVar26);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x280),
                   (Mat *)(p_Var28 + 0x1a8),*(int *)(p_Var28 + 0x10c),(Mat *)(p_Var28 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar31 = bottom_blob_bordered.c;
    iVar57 = bottom_blob_bordered.w;
    iVar56 = top_blob_int32.c;
    iVar40 = top_blob_int32.w;
    if ((iVar49 == 8) && (iVar4 == 1)) {
      p_Var28 = this->_vptr_Convolution_x86_avx[-3];
      iVar27 = *(int *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar34 = *(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar37 = *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar32 = *(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar35 = *(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var28);
      uVar29 = (ulong)(uint)bottom_blob_bordered.c;
      lVar44 = (long)top_blob_int32.w;
      local_1e0 = (void *)(ulong)(uint)top_blob_int32.h;
      pvVar51 = (void *)(ulong)(uint)top_blob_int32.c;
      uVar41 = iVar27 * iVar34;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar41,
                 (allocator_type *)&local_20c);
      if (0 < iVar34) {
        iVar43 = 0;
        iVar33 = 0;
        iVar36 = 0;
        do {
          if (0 < iVar27) {
            lVar46 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar43 * 4 + lVar46 * 4) = iVar33;
              iVar33 = iVar33 + iVar37;
              lVar46 = lVar46 + 1;
            } while (iVar27 != (int)lVar46);
            iVar43 = iVar43 + (int)lVar46;
          }
          iVar33 = iVar33 + (iVar57 * iVar32 - iVar37 * iVar27);
          iVar36 = iVar36 + 1;
        } while (iVar36 != iVar34);
      }
      if (0 < iVar56) {
        local_208 = (void *)0x0;
        do {
          if (0 < (int)local_1e0) {
            local_230 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * (long)local_208 +
                                (long)top_blob_int32.data);
            local_200 = (void *)0x0;
            do {
              if (0 < iVar40) {
                sVar52 = (this->weight_data_int8).cstep;
                local_1f8 = (long)local_200 * (long)local_1d0;
                sVar8 = (this->weight_data_int8).elemsize;
                pvVar58 = (this->weight_data_int8).data;
                lVar46 = 0;
                do {
                  if (iVar31 < 1) {
                    iVar56 = 0;
                  }
                  else {
                    uVar39 = 0;
                    iVar56 = 0;
                    pvVar55 = (void *)(sVar52 * sVar8 * (long)local_208 + (long)pvVar58);
                    do {
                      if (0 < (int)uVar41) {
                        uVar47 = 0;
                        do {
                          auVar62._8_8_ = 0;
                          auVar62._0_8_ =
                               *(ulong *)((long)bottom_blob_bordered.data +
                                         (long)*(int *)(opt_q._0_8_ + uVar47 * 4) * 8 +
                                         bottom_blob_bordered.elemsize * bottom_blob_bordered.cstep
                                         * uVar39 +
                                         (long)(iVar35 * 8 * (int)lVar46) +
                                         local_1f8 * bottom_blob_bordered.elemsize *
                                         (long)bottom_blob_bordered.w);
                          auVar61 = vpcmpgtb_avx((undefined1  [16])0x0,auVar62);
                          auVar62 = vpunpcklbw_avx(auVar62,auVar61);
                          auVar64._8_8_ = 0;
                          auVar64._0_8_ = *(ulong *)((long)pvVar55 + uVar47 * 8);
                          auVar61 = vpcmpgtb_avx((undefined1  [16])0x0,auVar64);
                          auVar61 = vpunpcklbw_avx(auVar64,auVar61);
                          auVar69 = vpmullw_avx(auVar61,auVar62);
                          auVar61 = vpmulhw_avx(auVar62,auVar61);
                          auVar62 = vpunpcklwd_avx(auVar69,auVar61);
                          auVar61 = vpunpckhwd_avx(auVar69,auVar61);
                          auVar61 = vpaddd_avx(auVar62,auVar61);
                          auVar61 = vphaddd_avx(auVar61,auVar61);
                          auVar61 = vphaddd_avx(auVar61,auVar61);
                          iVar56 = iVar56 + auVar61._0_4_;
                          uVar47 = uVar47 + 1;
                        } while (uVar41 != uVar47);
                        pvVar55 = (void *)((long)pvVar55 + (ulong)uVar41 * 8);
                      }
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar29);
                  }
                  *(int *)((long)local_230 + lVar46 * 4) = iVar56;
                  lVar46 = lVar46 + 1;
                } while (lVar46 != lVar44);
              }
              local_230 = (void *)((long)local_230 + lVar44 * 4);
              local_200 = (void *)((long)local_200 + 1);
            } while (local_200 != local_1e0);
          }
          local_208 = (void *)((long)local_208 + 1);
        } while (local_208 != pvVar51);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar26 = local_1d8;
      pMVar25 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx;
      p_Var7 = pp_Var6[-3];
      p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar44 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
          fVar60 = 0.0;
          if (fVar1 != 0.0) {
            fVar60 = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar44 * 4) = fVar60;
          lVar44 = lVar44 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
        } while (lVar44 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar25,pOVar26);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x280),
                   (Mat *)(p_Var28 + 0x1a8),*(int *)(p_Var28 + 0x10c),(Mat *)(p_Var28 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar31 = bottom_blob_bordered.c;
    iVar57 = top_blob_int32.c;
    iVar56 = top_blob_int32.w;
    pOVar26 = local_1d8;
    iVar40 = 0;
    opt_q.blob_allocator =
         (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
    if ((iVar49 == 1) &&
       (opt_q.blob_allocator =
             (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
       iVar4 == 1)) {
      if (((local_1d8->use_winograd_convolution == true) &&
          (((p_Var28 = this->_vptr_Convolution_x86_avx[-3],
            *(int *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3 &&
            (*(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         ((((*(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var28 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var28) == 1)) &&
          ((0xf < iVar3 &&
           (0xf < *(int *)(p_Var28 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))))) {
        conv3x3s1_winograd23_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_3x3_winograd23_int8,
                   local_1d8);
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var6 = this->_vptr_Convolution_x86_avx;
        p_Var7 = pp_Var6[-3];
        p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
        if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar44 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
            fVar60 = 0.0;
            if (fVar1 != 0.0) {
              fVar60 = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar44 * 4) = fVar60;
            lVar44 = lVar44 + 1;
            p_Var7 = pp_Var6[-3];
            p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
          } while (lVar44 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1ec < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x1a8),local_1d8);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,local_1e8,local_1d8);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x280),
                     (Mat *)(p_Var28 + 0x1a8),*(int *)(p_Var28 + 0x10c),(Mat *)(p_Var28 + 0x110),
                     local_1d8);
        }
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        if ((local_1d8->use_sgemm_convolution == true) &&
           (((p_Var28 = this->_vptr_Convolution_x86_avx[-3],
             *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(uint *)(p_Var28 + 0x1c + (long)&(this->weight_data_int8).data) < 2)))) {
          if (local_1ec < 0x65) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var28 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86_avx +
                      (long)this->_vptr_Convolution_x86_avx[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar44 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar44 = lVar44 + 1;
                p_Var28 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx +
                          (long)this->_vptr_Convolution_x86_avx[-3]);
              } while (lVar44 < *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar49 = *(int *)(p_Var28 + 0xd4);
            iVar3 = *(int *)(p_Var28 + 0xd8);
            iVar40 = *(int *)(p_Var28 + 0xe4);
            iVar56 = *(int *)(p_Var28 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_dequant_sse
                      (&bottom_blob_bordered,local_1e8,(Mat *)(p_Var28 + 0x160),iVar49,iVar3,iVar40,
                       iVar56,(Mat *)(p_Var28 + 0x1a8),&local_a8,pOVar26);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var28 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86_avx +
                      (long)this->_vptr_Convolution_x86_avx[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar44 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
                }
                scale_out = **(float **)(p_Var28 + 0x280);
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&scale_out);
                }
                else {
                  *(float *)opt_q.blob_allocator = scale_out;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar44 = lVar44 + 1;
                p_Var28 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx +
                          (long)this->_vptr_Convolution_x86_avx[-3]);
              } while (lVar44 < *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar49 = *(int *)(p_Var28 + 0xd4);
            iVar3 = *(int *)(p_Var28 + 0xd8);
            iVar40 = *(int *)(p_Var28 + 0xe4);
            iVar56 = *(int *)(p_Var28 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_requant_sse
                      (&bottom_blob_bordered,local_1e8,(Mat *)(p_Var28 + 0x160),iVar49,iVar3,iVar40,
                       iVar56,(Mat *)(p_Var28 + 0x1a8),&local_90,pOVar26);
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          pMVar25 = local_1e8;
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
          pLVar9 = this->activation;
          iVar40 = 0;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar25,pOVar26);
          }
          goto LAB_001bbc61;
        }
        p_Var28 = this->_vptr_Convolution_x86_avx[-3];
        iVar49 = *(int *)(p_Var28 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar3 = *(int *)(p_Var28 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar40 = *(int *)(p_Var28 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        iVar4 = *(int *)(p_Var28 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_200 = (void *)(long)*(int *)(p_Var28 + 0x44 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var28);
        local_1f8 = CONCAT44(local_1f8._4_4_,bottom_blob_bordered.w);
        uVar39 = (ulong)(uint)bottom_blob_bordered.c;
        lVar44 = (long)top_blob_int32.w;
        local_208 = (void *)(ulong)(uint)top_blob_int32.h;
        uVar29 = (ulong)(uint)top_blob_int32.c;
        uVar41 = iVar49 * iVar3;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar41,
                   (allocator_type *)&local_20c);
        if (0 < iVar3) {
          iVar27 = 0;
          iVar34 = 0;
          iVar37 = 0;
          do {
            if (0 < iVar49) {
              lVar46 = 0;
              do {
                *(int *)(opt_q._0_8_ + (long)iVar27 * 4 + lVar46 * 4) = iVar37;
                iVar37 = iVar37 + iVar40;
                lVar46 = lVar46 + 1;
              } while (iVar49 != (int)lVar46);
              iVar27 = iVar27 + (int)lVar46;
            }
            iVar37 = iVar37 + ((int)local_1f8 * iVar4 - iVar40 * iVar49);
            iVar34 = iVar34 + 1;
          } while (iVar34 != iVar3);
        }
        if (0 < iVar57) {
          local_218 = 0;
          do {
            if (0 < (int)local_208) {
              local_230 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * local_218 +
                                  (long)top_blob_int32.data);
              lVar46 = *(long *)(p_Var28 + 0x28 +
                                (long)&(this->weight_data_3x3_winograd23_int8).data);
              local_1e0 = (void *)0x0;
              do {
                if (0 < iVar56) {
                  local_1f8 = (long)local_1e0 * (long)local_1d0;
                  lVar30 = 0;
                  do {
                    if (iVar31 < 1) {
                      iVar49 = 0;
                    }
                    else {
                      uVar47 = 0;
                      iVar49 = 0;
                      lVar53 = (int)(iVar31 * uVar41 * (int)local_218) + lVar46;
                      do {
                        if (0 < (int)uVar41) {
                          uVar38 = 0;
                          do {
                            iVar49 = iVar49 + (int)*(char *)(lVar53 + uVar38) *
                                              (int)*(char *)((long)bottom_blob_bordered.data +
                                                            (long)*(int *)(opt_q._0_8_ + uVar38 * 4)
                                                            + bottom_blob_bordered.elemsize *
                                                              bottom_blob_bordered.cstep * uVar47 +
                                                              lVar30 * (long)local_200 +
                                                              local_1f8 *
                                                              bottom_blob_bordered.elemsize *
                                                              (long)bottom_blob_bordered.w);
                            uVar38 = uVar38 + 1;
                          } while (uVar41 != uVar38);
                        }
                        lVar53 = lVar53 + (int)uVar41;
                        uVar47 = uVar47 + 1;
                      } while (uVar47 != uVar39);
                    }
                    *(int *)((long)local_230 + lVar30 * 4) = iVar49;
                    lVar30 = lVar30 + 1;
                  } while (lVar30 != lVar44);
                }
                local_230 = (void *)((long)local_230 + lVar44 * 4);
                local_1e0 = (void *)((long)local_1e0 + 1);
              } while (local_1e0 != local_208);
            }
            local_218 = local_218 + 1;
          } while (local_218 != uVar29);
        }
        if (opt_q._0_8_ != 0) {
          operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
        }
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pOVar26 = local_1d8;
        pMVar25 = local_1e8;
        pp_Var6 = this->_vptr_Convolution_x86_avx;
        p_Var7 = pp_Var6[-3];
        p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
        if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar44 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var28 + 0x1f0) + lVar44 * 4);
            fVar60 = 0.0;
            if (fVar1 != 0.0) {
              fVar60 = 1.0 / (fVar1 * **(float **)(p_Var28 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar44 * 4) = fVar60;
            lVar44 = lVar44 + 1;
            p_Var7 = pp_Var6[-3];
            p_Var28 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)p_Var7);
          } while (lVar44 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1ec < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x1a8),local_1d8);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar25,pOVar26);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var28 + 0x280),
                     (Mat *)(p_Var28 + 0x1a8),*(int *)(p_Var28 + 0x10c),(Mat *)(p_Var28 + 0x110),
                     local_1d8);
        }
        piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (opt_q._32_8_ == 0) {
              if (opt_q._0_8_ != 0) {
                free((void *)opt_q._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
      iVar40 = 0;
    }
  }
LAB_001bbc61:
  piVar5 = (int *)CONCAT44(top_blob_int32.refcount._4_4_,top_blob_int32.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (top_blob_int32.allocator == (Allocator *)0x0) {
        if (top_blob_int32.data != (void *)0x0) {
          free(top_blob_int32.data);
        }
      }
      else {
        (*(top_blob_int32.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001bbc9d:
  piVar5 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}